

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# use_rtti.cpp
# Opt level: O0

void __thiscall L15_5::Magnificent::say(Magnificent *this)

{
  int iVar1;
  ostream *poVar2;
  Magnificent *this_local;
  
  poVar2 = std::operator<<((ostream *)&std::cout,"I hold the character ");
  poVar2 = std::operator<<(poVar2,this->_ch);
  poVar2 = std::operator<<(poVar2," and the integer ");
  iVar1 = (**(code **)(*(long *)this + 8))();
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,iVar1);
  std::operator<<(poVar2,"!\n");
  return;
}

Assistant:

void say() const {
            cout << "I hold the character " << _ch << " and the integer " << this->get_value() << "!\n";
        }